

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# areas.cpp
# Opt level: O2

bool __thiscall Area::allowsRandomPositionType(Area *this,ERandomPositionType type)

{
  byte bVar1;
  
  if (type == ForItem) {
    bVar1 = (byte)this->flags & 2;
  }
  else {
    if (type != ForMonster) {
      return true;
    }
    bVar1 = (byte)this->flags & 1;
  }
  return bVar1 == 0;
}

Assistant:

bool Area::allowsRandomPositionType(ERandomPositionType type)
{
    switch(type)
    {
    case ForMonster:
        return !(flags & NoMonsters);
    case ForItem:
        return !(flags & NoItems);
    default:
        return true;
    }
}